

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O0

int dwarf_discr_list(Dwarf_Debug dbg,Dwarf_Small *blockpointer,Dwarf_Unsigned blocklen,
                    Dwarf_Dsc_Head *dsc_head_out,Dwarf_Unsigned *dsc_array_length_out,
                    Dwarf_Error *error)

{
  Dwarf_Dsc_Head *blocklen_00;
  Dwarf_Small *blockpointer_00;
  void *pvVar1;
  Dwarf_Unsigned dscblocklen;
  Dwarf_Small *dscblockp;
  Dwarf_Dsc_Entry_s *ary;
  size_t arraycount;
  char *pcStack_48;
  int res;
  Dwarf_Dsc_Head h;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *dsc_array_length_out_local;
  Dwarf_Dsc_Head *dsc_head_out_local;
  Dwarf_Unsigned blocklen_local;
  Dwarf_Small *blockpointer_local;
  Dwarf_Debug dbg_local;
  
  pcStack_48 = (char *)0x0;
  arraycount._4_4_ = 0;
  ary = (Dwarf_Dsc_Entry_s *)0x0;
  h = (Dwarf_Dsc_Head)error;
  error_local = (Dwarf_Error *)dsc_array_length_out;
  dsc_array_length_out_local = (Dwarf_Unsigned *)dsc_head_out;
  dsc_head_out_local = (Dwarf_Dsc_Head *)blocklen;
  blocklen_local = (Dwarf_Unsigned)blockpointer;
  blockpointer_local = (Dwarf_Small *)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_discr_list()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (blocklen == 0) {
    dbg_local._4_4_ = -1;
  }
  else {
    blockpointer_00 = (Dwarf_Small *)calloc(blocklen,1);
    blocklen_00 = dsc_head_out_local;
    if (blockpointer_00 == (Dwarf_Small *)0x0) {
      _dwarf_error((Dwarf_Debug)blockpointer_local,(Dwarf_Error *)h,0x3e);
      dbg_local._4_4_ = 1;
    }
    else {
      memcpy(blockpointer_00,(void *)blocklen_local,(size_t)dsc_head_out_local);
      arraycount._4_4_ =
           get_dsc_leb_entries((Dwarf_Debug)blockpointer_local,blockpointer_00,
                               (Dwarf_Unsigned)blocklen_00,0,(Dwarf_Dsc_Entry_s *)0x0,(size_t *)&ary
                               ,(Dwarf_Error *)h);
      if (arraycount._4_4_ == 0) {
        pcStack_48 = _dwarf_get_alloc((Dwarf_Debug)blockpointer_local,'>',1);
        if (pcStack_48 == (char *)0x0) {
          free(blockpointer_00);
          _dwarf_error((Dwarf_Debug)blockpointer_local,(Dwarf_Error *)h,0x3e);
          dbg_local._4_4_ = 1;
        }
        else {
          *(Dwarf_Small **)(pcStack_48 + 0x10) = blockpointer_00;
          *(Dwarf_Dsc_Head **)(pcStack_48 + 0x18) = blocklen_00;
          *(Dwarf_Small **)pcStack_48 = blockpointer_local;
          pvVar1 = calloc((size_t)ary,0x28);
          if (pvVar1 == (void *)0x0) {
            dwarf_dealloc((Dwarf_Debug)blockpointer_local,pcStack_48,0x3e);
            _dwarf_error((Dwarf_Debug)blockpointer_local,(Dwarf_Error *)h,0x3e);
            dbg_local._4_4_ = 1;
          }
          else {
            *(Dwarf_Dsc_Entry_s **)(pcStack_48 + 8) = ary;
            *(void **)(pcStack_48 + 0x28) = pvVar1;
            pcStack_48[0x20] = '\0';
            pcStack_48[0x21] = '\0';
            pcStack_48[0x22] = '\0';
            pcStack_48[0x23] = '\0';
            pcStack_48[0x24] = '\0';
            pcStack_48[0x25] = '\0';
            pcStack_48[0x26] = '\0';
            pcStack_48[0x27] = '\0';
            *dsc_array_length_out_local = (Dwarf_Unsigned)pcStack_48;
            *error_local = (Dwarf_Error)ary;
            dbg_local._4_4_ = 0;
          }
        }
      }
      else {
        free(blockpointer_00);
        dbg_local._4_4_ = arraycount._4_4_;
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int dwarf_discr_list(Dwarf_Debug dbg,
    Dwarf_Small    * blockpointer,
    Dwarf_Unsigned   blocklen,
    Dwarf_Dsc_Head * dsc_head_out,
    Dwarf_Unsigned * dsc_array_length_out,
    Dwarf_Error    * error)
{
    Dwarf_Dsc_Head h = 0;
    int res = 0;
    size_t arraycount = 0;
    struct Dwarf_Dsc_Entry_s *ary = 0;
    Dwarf_Small * dscblockp = 0;
    Dwarf_Unsigned dscblocklen = 0;

    CHECK_DBG(dbg,error,"dwarf_discr_list()");
    if (blocklen == 0) {
        return DW_DLV_NO_ENTRY;
    }
    dscblockp = (Dwarf_Small *)calloc(blocklen,sizeof(Dwarf_Small));
    if (!dscblockp) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    dscblocklen = blocklen;
    memcpy(dscblockp,blockpointer,blocklen);

    res = get_dsc_leb_entries(dbg,dscblockp,dscblocklen,
        /*  TRUE or FALSE here is not important, the arraycount
            returned to us will be identical either way. */
        FALSE, 0, &arraycount,error);
    if (res != DW_DLV_OK) {
        free(dscblockp);
        return res;
    }

    h = (Dwarf_Dsc_Head)_dwarf_get_alloc(dbg,DW_DLA_DSC_HEAD,1);
    if (!h) {
        free(dscblockp);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }

    h->dsh_block = dscblockp;
    h->dsh_block_len = dscblocklen;
    h->dsh_debug = dbg;
    /* Now the destructor for h will deal with block malloc space. */

    ary = (struct Dwarf_Dsc_Entry_s *)calloc(arraycount,
        sizeof(struct Dwarf_Dsc_Entry_s));
    if (!ary) {
        dwarf_dealloc(dbg,h,DW_DLA_DSC_HEAD);
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    h->dsh_count = arraycount;
    h->dsh_array = ary;
    h->dsh_set_unsigned = 0;
    h->dsh_set_signed = 0;

    *dsc_head_out = h;
    *dsc_array_length_out = arraycount;
    return DW_DLV_OK;
}